

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataSource.cpp
# Opt level: O1

double __thiscall csv::icu::FileDataSource::progress(FileDataSource *this)

{
  FILE *__stream;
  long lVar1;
  double dVar2;
  double dVar3;
  
  __stream = (FILE *)u_fgetfile_70(this->_in);
  lVar1 = ftell(__stream);
  dVar3 = (double)lVar1 / (double)this->_length;
  dVar2 = 1.0;
  if (dVar3 <= 1.0) {
    dVar2 = dVar3;
  }
  return dVar2;
}

Assistant:

double FileDataSource::progress() {
		// ICU appears to perform buffering from the underlying file handle in order to optimize reading
		// As such this method is not byte-accurate as it will depend on how much data ICU buffers during reading
		// So, for small files the progress will always be 1.0, however for larger files it will chunk.
		FILE* internal_file = u_fgetfile(_in);
		double pos = ftell(internal_file);
		double len = _length;
		return std::min(pos / len, 1.0);
	}